

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_action(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node_action **actions)

{
  lysp_ext_instance **exts;
  ly_stmt stmt_00;
  lysp_node_action *plVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  lysp_node_action *parent_00;
  lysp_node_action *plVar4;
  char *pcVar5;
  lysp_node_action_inout *inout_p;
  uint32_t substmt_index;
  ly_ctx *plVar6;
  char *in_R8;
  lysp_ext_instance **in_R9;
  char *pcVar7;
  lysp_stmt *stmt_01;
  bool bVar8;
  
  LVar2 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  LVar3 = LVar2;
  if (LVar2 == LY_SUCCESS) {
    parent_00 = (lysp_node_action *)calloc(1,0x110);
    if (parent_00 == (lysp_node_action *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      in_R8 = "lysp_stmt_action";
      LVar2 = LY_EMEM;
      ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
    }
    else {
      plVar1 = *actions;
      if (*actions == (lysp_node_action *)0x0) {
        *actions = parent_00;
      }
      else {
        do {
          plVar4 = plVar1;
          plVar1 = (lysp_node_action *)(plVar4->field_0).node.next;
        } while (plVar1 != (lysp_node_action *)0x0);
        (plVar4->field_0).field_1.next = parent_00;
      }
    }
    LVar3 = LVar2;
    if (parent_00 != (lysp_node_action *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar6,stmt->arg,0,&(parent_00->field_0).node.name);
      if (LVar3 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = (ushort)(parent != (lysp_node *)0x0) * 0x100 + 0x100;
        (parent_00->field_0).node.parent = parent;
        stmt_01 = stmt->child;
        bVar8 = stmt_01 == (lysp_stmt *)0x0;
        LVar3 = LVar2;
        if (!bVar8) {
          exts = &(parent_00->field_0).node.exts;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0xf0000) {
              if ((int)stmt_00 < 0x800) {
                inout_p = &parent_00->input;
                if ((stmt_00 != LY_STMT_INPUT) &&
                   (inout_p = &parent_00->output, stmt_00 != LY_STMT_OUTPUT)) {
LAB_0016aca2:
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar6 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar6 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar5 = lyplg_ext_stmt2str(stmt_00);
                  pcVar7 = "action";
                  if (parent == (lysp_node *)0x0) {
                    pcVar7 = "rpc";
                  }
                  ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,pcVar7);
                  LVar3 = LY_EVALID;
                  break;
                }
                LVar3 = lysp_stmt_inout(ctx,stmt_01,(lysp_node *)parent_00,inout_p);
              }
              else {
                if (stmt_00 != LY_STMT_GROUPING) {
                  substmt_index = (int)parent_00 + 0x20;
                  if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_0016ab9c;
                  goto LAB_0016aca2;
                }
                LVar3 = lysp_stmt_grouping(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->groupings)
                ;
              }
            }
            else if ((int)stmt_00 < 0x270000) {
              if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
                in_R8 = (char *)exts;
                LVar3 = lysp_stmt_ext(ctx,stmt_01,
                                      (uint)(parent == (lysp_node *)0x0) * 8 + LY_STMT_ACTION,0,exts
                                     );
              }
              else {
                if (stmt_00 != LY_STMT_IF_FEATURE) goto LAB_0016aca2;
                LVar3 = lysp_stmt_qnames(ctx,stmt_01,&(parent_00->field_0).node.iffeatures,
                                         (yang_arg)exts,(lysp_ext_instance **)in_R8);
              }
            }
            else {
              substmt_index = (int)parent_00 + 0x28;
              if (stmt_00 == LY_STMT_REFERENCE) {
LAB_0016ab9c:
                in_R8 = (char *)exts;
                LVar3 = lysp_stmt_text_field
                                  (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
              }
              else if (stmt_00 == LY_STMT_STATUS) {
                LVar3 = lysp_stmt_status(ctx,stmt_01,&(parent_00->field_0).node.flags,exts);
              }
              else {
                if (stmt_00 != LY_STMT_TYPEDEF) goto LAB_0016aca2;
                LVar3 = lysp_stmt_typedef(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->typedefs);
              }
            }
            if (LVar3 != LY_SUCCESS) break;
            stmt_01 = stmt_01->next;
            bVar8 = stmt_01 == (lysp_stmt *)0x0;
            LVar3 = LVar2;
          } while (!bVar8);
        }
        if (bVar8) {
          if ((parent_00->input).field_0.node.nodetype == 0) {
            (parent_00->input).field_0.node.nodetype = 0x1000;
            (parent_00->input).field_0.node.parent = (lysp_node *)parent_00;
            if (ctx == (lysp_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            LVar3 = lydict_insert(plVar6,"input",0,&(parent_00->input).field_0.node.name);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
          }
          if ((parent_00->output).field_0.node.nodetype == 0) {
            (parent_00->output).field_0.node.nodetype = 0x2000;
            (parent_00->output).field_0.node.parent = (lysp_node *)parent_00;
            if (ctx == (lysp_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            LVar3 = lydict_insert(plVar6,"output",0,&(parent_00->output).field_0.node.name);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
          }
          LVar3 = LY_SUCCESS;
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_action(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node_action **actions)
{
    struct lysp_node_action *act;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    LY_LIST_NEW_RET(PARSER_CTX(ctx), actions, act, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &act->name));
    act->nodetype = parent ? LYS_ACTION : LYS_RPC;
    act->parent = parent;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &act->dsc, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &act->iffeatures, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &act->ref, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &act->flags, &act->exts));
            break;

        case LY_STMT_INPUT:
            LY_CHECK_RET(lysp_stmt_inout(ctx, child, &act->node, &act->input));
            break;
        case LY_STMT_OUTPUT:
            LY_CHECK_RET(lysp_stmt_inout(ctx, child, &act->node, &act->output));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(lysp_stmt_typedef(ctx, child, &act->node, &act->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(lysp_stmt_grouping(ctx, child, &act->node, &act->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, parent ? LY_STMT_ACTION : LY_STMT_RPC, 0, &act->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), parent ? "action" : "rpc");
            return LY_EVALID;
        }
    }

    /* always initialize inout, they are technically present (needed for later deviations/refines) */
    if (!act->input.nodetype) {
        act->input.nodetype = LYS_INPUT;
        act->input.parent = &act->node;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "input", 0, &act->input.name));
    }
    if (!act->output.nodetype) {
        act->output.nodetype = LYS_OUTPUT;
        act->output.parent = &act->node;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "output", 0, &act->output.name));
    }

    return LY_SUCCESS;
}